

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O3

void __thiscall Rml::Element::GetRML(Element *this,String *content)

{
  pointer ppVar1;
  NodePtr pDVar2;
  ulong uVar3;
  Element *pEVar4;
  ulong *puVar5;
  bool bVar6;
  int iVar7;
  PropertyMap *this_00;
  String *pSVar8;
  ulong uVar9;
  NodePtr pDVar10;
  uint8_t *puVar11;
  ulong *puVar12;
  String *name;
  pointer ppVar13;
  const_iterator cVar14;
  String value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  Element *local_60;
  PropertyMap *local_58;
  String local_50;
  
  ::std::__cxx11::string::append((char *)content);
  ::std::__cxx11::string::_M_append((char *)content,(ulong)(this->tag)._M_dataplus._M_p);
  ppVar13 = (this->attributes).m_container.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->attributes).m_container.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_60 = this;
  if (ppVar13 != ppVar1) {
    do {
      iVar7 = ::std::__cxx11::string::compare((char *)ppVar13);
      if (iVar7 != 0) {
        local_80._M_string_length = 0;
        local_80.field_2._M_local_buf[0] = '\0';
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        bVar6 = Variant::
                GetInto<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                          (&ppVar13->second,&local_80);
        if (bVar6) {
          ::std::__cxx11::string::push_back((char)content);
          ::std::__cxx11::string::_M_append
                    ((char *)content,(ulong)(ppVar13->first)._M_dataplus._M_p);
          ::std::__cxx11::string::append((char *)content);
          ::std::__cxx11::string::_M_append((char *)content,(ulong)local_80._M_dataplus._M_p);
          ::std::__cxx11::string::append((char *)content);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,
                          CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                   local_80.field_2._M_local_buf[0]) + 1);
        }
      }
      ppVar13 = ppVar13 + 1;
    } while (ppVar13 != ppVar1);
  }
  this_00 = ElementStyle::GetLocalStyleProperties(&local_60->meta->style);
  if (this_00->mNumElements != 0) {
    ::std::__cxx11::string::append((char *)content);
  }
  cVar14 = robin_hood::detail::
           Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
           ::cbegin(this_00);
  pDVar2 = (NodePtr)this_00->mInfo;
  local_58 = this_00;
  if (cVar14.mKeyVals != pDVar2) {
    do {
      puVar11 = cVar14.mInfo;
      pDVar10 = cVar14.mKeyVals;
      pSVar8 = StyleSheetSpecification::GetPropertyName_abi_cxx11_((pDVar10->mData).first);
      ::std::__cxx11::string::_M_append((char *)content,(ulong)(pSVar8->_M_dataplus)._M_p);
      ::std::__cxx11::string::append((char *)content);
      Property::ToString_abi_cxx11_(&local_50,&(pDVar10->mData).second);
      StringUtilities::EncodeRml(&local_80,&local_50);
      ::std::__cxx11::string::_M_append((char *)content,(ulong)local_80._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,
                        CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                 local_80.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::string::append((char *)content);
      pDVar10 = pDVar10 + 1;
      uVar9 = *(ulong *)(puVar11 + 1);
      if (uVar9 == 0) {
        puVar5 = (ulong *)(puVar11 + 9);
        do {
          puVar12 = puVar5;
          pDVar10 = pDVar10 + 8;
          uVar9 = *puVar12;
          puVar5 = puVar12 + 1;
        } while (uVar9 == 0);
      }
      else {
        puVar12 = (ulong *)(puVar11 + 1);
      }
      uVar3 = 0;
      if (uVar9 != 0) {
        for (; (uVar9 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      uVar9 = uVar3 >> 3 & 0x1fffffff;
      cVar14.mInfo = (uint8_t *)((long)puVar12 + uVar9);
      cVar14.mKeyVals = pDVar10 + uVar9;
    } while (pDVar10 + uVar9 != pDVar2);
  }
  pEVar4 = local_60;
  if (local_58->mNumElements != 0) {
    (content->_M_dataplus)._M_p[content->_M_string_length - 1] = '\"';
  }
  if (local_60->num_non_dom_children <
      (int)((ulong)((long)(local_60->children).
                          super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(local_60->children).
                         super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3)) {
    ::std::__cxx11::string::append((char *)content);
    (*(pEVar4->super_ScriptInterface).super_Releasable._vptr_Releasable[8])(pEVar4,content);
    ::std::__cxx11::string::append((char *)content);
    ::std::__cxx11::string::_M_append((char *)content,(ulong)(pEVar4->tag)._M_dataplus._M_p);
  }
  ::std::__cxx11::string::append((char *)content);
  return;
}

Assistant:

void Element::GetRML(String& content)
{
	// First we start the open tag, add the attributes then close the open tag.
	// Then comes the children in order, then we add our close tag.
	content += "<";
	content += tag;

	for (auto& pair : attributes)
	{
		const String& name = pair.first;
		if (name == "style")
			continue;

		const Variant& variant = pair.second;
		String value;
		if (variant.GetInto(value))
		{
			content += ' ';
			content += name;
			content += "=\"";
			content += value;
			content += "\"";
		}
	}

	const PropertyMap& local_properties = meta->style.GetLocalStyleProperties();
	if (!local_properties.empty())
		content += " style=\"";

	for (const auto& pair : local_properties)
	{
		const PropertyId id = pair.first;
		const Property& property = pair.second;

		content += StyleSheetSpecification::GetPropertyName(id);
		content += ": ";
		content += StringUtilities::EncodeRml(property.ToString());
		content += "; ";
	}

	if (!local_properties.empty())
		content.back() = '\"';

	if (HasChildNodes())
	{
		content += ">";

		GetInnerRML(content);

		content += "</";
		content += tag;
		content += ">";
	}
	else
	{
		content += " />";
	}
}